

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

UnitNode * pop(UnitList *stack)

{
  UnitNode *pUVar1;
  UnitNode *local_20;
  UnitNode *request;
  UnitNode *tempNode;
  UnitList *stack_local;
  
  local_20 = (UnitNode *)0x0;
  if (stack->count != 0) {
    pUVar1 = stack->head->next;
    local_20 = stack->head;
    stack->count = stack->count + -1;
    stack->head = pUVar1;
  }
  if (stack->head != (UnitNode *)0x0) {
    stack->head->prev = (UnitNode *)0x0;
  }
  return local_20;
}

Assistant:

struct UnitNode *pop(struct UnitList *stack) {

    struct UnitNode *tempNode, *request = NULL;

    if (stack->count) {
        tempNode = stack->head->next;
        request = stack->head;
        stack->count--;
        stack->head = tempNode;
    }

    if (stack->head)
        stack->head->prev = NULL;

    return request;
}